

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlaterIntegrals.hpp
# Opt level: O0

RealType RosenA(int n,RealType a)

{
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  int nu;
  RealType Term;
  RealType RosenA_;
  undefined4 local_24;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = 0.0;
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    local_20 = 1.0;
    local_18 = 1.0;
    for (local_24 = 1; local_24 <= in_EDI; local_24 = local_24 + 1) {
      local_20 = (in_XMM0_Qa / (double)local_24) * local_20;
      local_18 = local_20 + local_18;
    }
    dVar1 = exp(-in_XMM0_Qa);
    local_18 = (local_18 / local_20) * (dVar1 / in_XMM0_Qa);
  }
  return local_18;
}

Assistant:

inline RealType RosenA(int n, RealType a) {
  RealType RosenA_ = 0.;
  if (a != 0.) {
    RealType Term = 1.;
    RosenA_       = Term;
    for (int nu = 1; nu <= n; nu++) {
      Term *= a / nu;
      RosenA_ += Term;
    }
    RosenA_ = (RosenA_ / Term) * (exp(-a) / a);
  }
  return RosenA_;
}